

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int GetLast360DataFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,int *pNbMeasurements)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  lVar16 = 0;
  lVar9 = 0;
  while (*(RPLIDAR **)((long)addrsRPLIDAR + lVar16 * 2) != pRPLIDAR) {
    lVar9 = lVar9 + 0x28;
    lVar16 = lVar16 + 4;
    if (lVar9 == 0x280) {
      return 1;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)RPLIDARCS + lVar9));
  lVar14 = *(long *)((long)&anglesvectorRPLIDAR[0].
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node + lVar9 * 2);
  lVar2 = *(long *)((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node + lVar9 * 2);
  lVar3 = *(long *)((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar9 * 2);
  uVar6 = (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_start._M_last + lVar9 * 2) -
                       lVar3) >> 3) +
          (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_cur + lVar9 * 2) -
                       *(long *)((long)&anglesvectorRPLIDAR[0].
                                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                        super__Deque_impl_data._M_finish._M_first + lVar9 * 2)) >> 3
               ) + ((int)((ulong)(lVar14 - lVar2) >> 3) + -1 + (uint)(lVar14 == 0)) * 0x40;
  *pNbMeasurements = uVar6;
  if (0 < (int)uVar6) {
    lVar4 = *(long *)((long)&distancesvectorRPLIDAR[0].
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur + lVar9 * 2);
    lVar10 = lVar3 - *(long *)((long)&anglesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_start._M_first + lVar9 * 2) >> 3;
    lVar13 = lVar4 - *(long *)((long)&distancesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_start._M_first + lVar9 * 2) >> 3;
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar14 = uVar7 + 1;
    lVar8 = (lVar10 + uVar7) * 8;
    lVar15 = (lVar13 + uVar7) * 8;
    do {
      lVar15 = lVar15 + -8;
      lVar8 = lVar8 + -8;
      uVar7 = uVar7 - 1;
      uVar11 = (lVar10 + lVar14) - 2;
      if (uVar11 < 0x40) {
        pdVar12 = (double *)(lVar3 + uVar7 * 8);
      }
      else {
        uVar5 = uVar11 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar11) {
          uVar5 = uVar11 >> 6;
        }
        pdVar12 = (double *)(*(long *)(lVar2 + uVar5 * 8) + uVar5 * -0x200 + lVar8);
      }
      pAngles[lVar14 + -2] = *pdVar12;
      uVar11 = (lVar13 + lVar14) - 2;
      if (uVar11 < 0x40) {
        pdVar12 = (double *)(lVar4 + uVar7 * 8);
      }
      else {
        uVar5 = uVar11 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar11) {
          uVar5 = uVar11 >> 6;
        }
        pdVar12 = (double *)
                  (*(long *)(*(long *)((long)&distancesvectorRPLIDAR[0].
                                              super__Deque_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Deque_impl_data._M_start._M_node +
                                      lVar9 * 2) + uVar5 * 8) + uVar5 * -0x200 + lVar15);
      }
      pDistances[lVar14 + -2] = *pdVar12;
      lVar14 = lVar14 + -1;
    } while (1 < lVar14);
  }
  iVar1 = *(int *)((long)resRPLIDAR + lVar16);
  pthread_mutex_unlock((pthread_mutex_t *)((long)RPLIDARCS + lVar9));
  if (*pNbMeasurements < 1) {
    return 2;
  }
  return iVar1;
}

Assistant:

HARDWAREX_API int GetLast360DataFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, int* pNbMeasurements)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	*pNbMeasurements = (int)anglesvectorRPLIDAR[id].size();
	for (int i = *pNbMeasurements-1; i >= 0; i--)
	{
		pAngles[i] = anglesvectorRPLIDAR[id][i];
		pDistances[i] = distancesvectorRPLIDAR[id][i];
	}
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	if (*pNbMeasurements <= 0) return EXIT_TIMEOUT;
	return res;
#else
	return EXIT_NOT_IMPLEMENTED;
#endif // __cplusplus
}